

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::BasicReporter::ReportCounts(BasicReporter *this,Totals *totals,string *allPrefix)

{
  size_t sVar1;
  ostream *poVar2;
  allocator<char> local_139;
  string local_138;
  pluralise local_118;
  allocator<char> local_e9;
  string local_e8;
  pluralise local_c8;
  undefined1 local_a0 [8];
  TextColour colour_1;
  string local_88;
  allocator<char> local_51;
  string local_50;
  undefined1 local_30 [8];
  TextColour colour;
  string *allPrefix_local;
  Totals *totals_local;
  BasicReporter *this_local;
  
  colour.m_impl = (ConsoleColourImpl *)allPrefix;
  sVar1 = Counts::total(&totals->assertions);
  if (sVar1 == 0) {
    std::operator<<((this->m_config).stream,"No tests ran");
  }
  else if ((totals->assertions).failed == 0) {
    TextColour::TextColour((TextColour *)local_a0,ResultSuccess);
    poVar2 = std::operator<<((this->m_config).stream,(string *)colour.m_impl);
    poVar2 = std::operator<<(poVar2,"tests passed (");
    sVar1 = (totals->assertions).passed;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"assertion",&local_e9);
    pluralise::pluralise(&local_c8,sVar1,&local_e8);
    poVar2 = Catch::operator<<(poVar2,&local_c8);
    poVar2 = std::operator<<(poVar2," in ");
    sVar1 = (totals->testCases).passed;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"test case",&local_139);
    pluralise::pluralise(&local_118,sVar1,&local_138);
    poVar2 = Catch::operator<<(poVar2,&local_118);
    std::operator<<(poVar2,")");
    pluralise::~pluralise(&local_118);
    std::__cxx11::string::~string((string *)&local_138);
    std::allocator<char>::~allocator(&local_139);
    pluralise::~pluralise(&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator(&local_e9);
    TextColour::~TextColour((TextColour *)local_a0);
  }
  else {
    TextColour::TextColour((TextColour *)local_30,ResultError);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"test case",&local_51);
    ReportCounts(this,&local_50,&totals->testCases,(string *)colour.m_impl);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
    if ((totals->testCases).failed != 0) {
      std::operator<<((this->m_config).stream," (");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,"assertion",(allocator<char> *)((long)&colour_1.m_impl + 7));
      ReportCounts(this,&local_88,&totals->assertions,(string *)colour.m_impl);
      std::__cxx11::string::~string((string *)&local_88);
      std::allocator<char>::~allocator((allocator<char> *)((long)&colour_1.m_impl + 7));
      std::operator<<((this->m_config).stream,")");
    }
    TextColour::~TextColour((TextColour *)local_30);
  }
  return;
}

Assistant:

void ReportCounts( const Totals& totals, const std::string& allPrefix = "All " ) {
            if( totals.assertions.total() == 0 ) {
                m_config.stream << "No tests ran";
            }
            else if( totals.assertions.failed ) {
                TextColour colour( TextColour::ResultError );
                ReportCounts( "test case", totals.testCases, allPrefix );
                if( totals.testCases.failed > 0 ) {
                    m_config.stream << " (";
                    ReportCounts( "assertion", totals.assertions, allPrefix );
                    m_config.stream << ")";
                }
            }
            else {
                TextColour colour( TextColour::ResultSuccess );
                m_config.stream   << allPrefix << "tests passed ("
                                    << pluralise( totals.assertions.passed, "assertion" ) << " in "
                                    << pluralise( totals.testCases.passed, "test case" ) << ")";
            }
        }